

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O1

void ImGui_ImplGlfw_RestoreCallbacks(GLFWwindow *window)

{
  void *pvVar1;
  ImGuiIO *pIVar2;
  
  ImGui::GetCurrentContext();
  pIVar2 = ImGui::GetIO();
  pvVar1 = pIVar2->BackendPlatformUserData;
  glfwSetWindowFocusCallback(window,*(GLFWwindowfocusfun *)((long)pvVar1 + 0x78));
  glfwSetCursorEnterCallback(window,*(GLFWcursorenterfun *)((long)pvVar1 + 0x88));
  glfwSetCursorPosCallback(window,*(GLFWcursorposfun *)((long)pvVar1 + 0x80));
  glfwSetMouseButtonCallback(window,*(GLFWmousebuttonfun *)((long)pvVar1 + 0x90));
  glfwSetScrollCallback(window,*(GLFWscrollfun *)((long)pvVar1 + 0x98));
  glfwSetKeyCallback(window,*(GLFWkeyfun *)((long)pvVar1 + 0xa0));
  glfwSetCharCallback(window,*(GLFWcharfun *)((long)pvVar1 + 0xa8));
  glfwSetMonitorCallback(*(GLFWmonitorfun *)((long)pvVar1 + 0xb0));
  *(undefined1 *)((long)pvVar1 + 0x70) = 0;
  *(undefined8 *)((long)pvVar1 + 0x78) = 0;
  *(undefined8 *)((long)pvVar1 + 0x80) = 0;
  *(undefined8 *)((long)pvVar1 + 0x88) = 0;
  *(undefined8 *)((long)pvVar1 + 0x90) = 0;
  *(undefined8 *)((long)pvVar1 + 0x98) = 0;
  *(undefined8 *)((long)pvVar1 + 0xa0) = 0;
  *(undefined8 *)((long)pvVar1 + 0xa8) = 0;
  *(undefined8 *)((long)pvVar1 + 0xb0) = 0;
  return;
}

Assistant:

void ImGui_ImplGlfw_RestoreCallbacks(GLFWwindow* window)
{
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    IM_ASSERT(bd->InstalledCallbacks == true && "Callbacks not installed!");
    IM_ASSERT(bd->Window == window);

    glfwSetWindowFocusCallback(window, bd->PrevUserCallbackWindowFocus);
    glfwSetCursorEnterCallback(window, bd->PrevUserCallbackCursorEnter);
    glfwSetCursorPosCallback(window, bd->PrevUserCallbackCursorPos);
    glfwSetMouseButtonCallback(window, bd->PrevUserCallbackMousebutton);
    glfwSetScrollCallback(window, bd->PrevUserCallbackScroll);
    glfwSetKeyCallback(window, bd->PrevUserCallbackKey);
    glfwSetCharCallback(window, bd->PrevUserCallbackChar);
    glfwSetMonitorCallback(bd->PrevUserCallbackMonitor);
    bd->InstalledCallbacks = false;
    bd->PrevUserCallbackWindowFocus = nullptr;
    bd->PrevUserCallbackCursorEnter = nullptr;
    bd->PrevUserCallbackCursorPos = nullptr;
    bd->PrevUserCallbackMousebutton = nullptr;
    bd->PrevUserCallbackScroll = nullptr;
    bd->PrevUserCallbackKey = nullptr;
    bd->PrevUserCallbackChar = nullptr;
    bd->PrevUserCallbackMonitor = nullptr;
}